

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTest.cpp
# Opt level: O0

void __thiscall Microsoft::VisualStudio::CppUnitTestFramework::JITTest::JITAddFunc(JITTest *this)

{
  int iVar1;
  undefined4 in_stack_fffffffffffffc88;
  uint32_t in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  ZoneHashNode **ppZVar2;
  uint32_t instId;
  CodeHolder *this_00;
  int local_34c;
  int local_348;
  int local_344;
  int result;
  Error err;
  Func fn;
  X86Assembler as;
  CodeHolder code;
  JitRuntime rt;
  JITTest *this_local;
  
  ppZVar2 = code._namedLabels.super_ZoneHashBase._embedded;
  asmjit::JitRuntime::JitRuntime
            ((JitRuntime *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  this_00 = (CodeHolder *)(&as.super_Assembler._op5.field_0._signature + 2);
  asmjit::CodeHolder::CodeHolder
            ((CodeHolder *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  asmjit::CodeHolder::init(this_00,(EVP_PKEY_CTX *)(ppZVar2 + 1));
  instId = (uint32_t)((ulong)ppZVar2 >> 0x20);
  asmjit::X86Assembler::X86Assembler
            ((X86Assembler *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (CodeHolder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)this_00,instId,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)this_00,instId,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             (Operand_ *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
             in_stack_fffffffffffffc8c);
  local_344 = (**(code **)(code._namedLabels.super_ZoneHashBase._embedded[0] + 0x10))
                        (code._namedLabels.super_ZoneHashBase._embedded,&result,
                         (undefined1 *)((long)&as.super_Assembler._op5.field_0 + 8));
  if (local_344 != 0) {
    Assert::Fail(L"Failed to compile the code.");
  }
  iVar1 = (*_result)(100,200);
  local_34c = 300;
  local_348 = iVar1;
  Assert::AreEqual<int>(&local_348,&local_34c,(wchar_t *)0x0);
  (**(code **)(code._namedLabels.super_ZoneHashBase._embedded[0] + 0x18))
            (code._namedLabels.super_ZoneHashBase._embedded,_result);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x2a57d6);
  asmjit::CodeHolder::~CodeHolder
            ((CodeHolder *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  asmjit::JitRuntime::~JitRuntime((JitRuntime *)CONCAT44(iVar1,in_stack_fffffffffffffc90));
  return;
}

Assistant:

TEST_METHOD(JITAddFunc)
		{
			typedef int (*Func)(int a, int b);

			using namespace asmjit;

			JitRuntime rt;

			CodeHolder code;
			code.init(rt.getCodeInfo());

			X86Assembler as(&code);

#if defined(CENTAURUS_BUILD_WINDOWS)
			as.mov(x86::rax, x86::rcx);
			as.add(x86::rax, x86::rdx);
#elif defined(CENTAURUS_BUILD_LINUX)
            as.mov(x86::rax, x86::rsi);
            as.add(x86::rax, x86::rdi);
#endif
			as.ret();

			Func fn;

			Error err = rt.add(&fn, &code);

			if (err) Assert::Fail(L"Failed to compile the code.");

			int result = fn(100, 200);

			Assert::AreEqual(result, 300);

			rt.release(fn);
		}